

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8 * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  uint8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  uint8 *puVar4;
  int size;
  void *data;
  uint local_2c;
  uint8 *local_28;
  
  if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
    this->had_error_ = true;
  }
  else {
    puVar1 = this->end_;
    puVar4 = this->buffer_;
    if (this->buffer_end_ != (uint8 *)0x0) {
      memcpy(this->buffer_end_,puVar4,(long)puVar1 - (long)puVar4);
      do {
        iVar3 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&local_28,&local_2c);
        if ((char)iVar3 == '\0') {
          this->had_error_ = true;
          goto LAB_00250590;
        }
      } while ((ulong)local_2c == 0);
      puVar1 = this->end_;
      if (0x10 < (int)local_2c) {
        uVar2 = *(undefined8 *)(puVar1 + 8);
        *(undefined8 *)local_28 = *(undefined8 *)puVar1;
        *(undefined8 *)(local_28 + 8) = uVar2;
        this->end_ = local_28 + ((ulong)local_2c - 0x10);
        this->buffer_end_ = (uint8 *)0x0;
        return local_28;
      }
      uVar2 = *(undefined8 *)(puVar1 + 8);
      *(undefined8 *)puVar4 = *(undefined8 *)puVar1;
      *(undefined8 *)(this->buffer_ + 8) = uVar2;
      this->buffer_end_ = local_28;
      puVar4 = puVar4 + (int)local_2c;
      goto LAB_00250594;
    }
    uVar2 = *(undefined8 *)(puVar1 + 8);
    *(undefined8 *)puVar4 = *(undefined8 *)puVar1;
    *(undefined8 *)(this->buffer_ + 8) = uVar2;
    this->buffer_end_ = puVar1;
  }
LAB_00250590:
  puVar4 = this->buffer_ + 0x10;
LAB_00250594:
  this->end_ = puVar4;
  return this->buffer_;
}

Assistant:

uint8* EpsCopyOutputStream::Next() {
  GOOGLE_DCHECK(!had_error_);  // NOLINT
  if (PROTOBUF_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8* ptr;
    int size;
    do {
      void* data;
      if (PROTOBUF_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8*>(data);
    } while (size == 0);
    if (PROTOBUF_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      GOOGLE_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}